

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

void __thiscall PF_BufferMgr::~PF_BufferMgr(PF_BufferMgr *this)

{
  PF_BufPageDesc *pPVar1;
  void *pvVar2;
  StatisticsMgr *pSVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; pPVar1 = this->bufTable, lVar5 < this->numPages; lVar5 = lVar5 + 1) {
    pvVar2 = *(void **)((long)&pPVar1->pData + lVar4);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    lVar4 = lVar4 + 0x20;
  }
  if (pPVar1 != (PF_BufPageDesc *)0x0) {
    operator_delete__(pPVar1);
  }
  pSVar3 = pStatisticsMgr;
  if (pStatisticsMgr != (StatisticsMgr *)0x0) {
    LinkList<Statistic>::Erase(&pStatisticsMgr->llStats);
  }
  operator_delete(pSVar3);
  PF_HashTable::~PF_HashTable(&this->hashTable);
  return;
}

Assistant:

PF_BufferMgr::~PF_BufferMgr()
{
   // Free up buffer pages and tables
   for (int i = 0; i < this->numPages; i++)
      delete [] bufTable[i].pData;

   delete [] bufTable;

#ifdef PF_STATS
   // Destroy the global statistics manager
   delete pStatisticsMgr;
#endif

#ifdef PF_LOG
   WriteLog("Destroyed the buffer manager.\n");
#endif
}